

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall CSlidingBucket::~CSlidingBucket(CSlidingBucket *this)

{
  AbstractSearchState **__ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = this->numofbuckets;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      __ptr = this->bucketV[lVar2];
      if (__ptr != (AbstractSearchState **)0x0) {
        if (this->initialdynamicsize == 0) {
          operator_delete__(__ptr);
        }
        else {
          free(__ptr);
        }
        this->bucketV[lVar2] = (AbstractSearchState **)0x0;
        iVar1 = this->numofbuckets;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if ((this->initialdynamicsize != 0) && (this->dynamicsize != (int *)0x0)) {
    operator_delete__(this->dynamicsize);
  }
  if (this->bucketV != (AbstractSearchState ***)0x0) {
    operator_delete__(this->bucketV);
  }
  this->bucketV = (AbstractSearchState ***)0x0;
  if (this->lastelementindexV != (int *)0x0) {
    operator_delete__(this->lastelementindexV);
    return;
  }
  return;
}

Assistant:

~CSlidingBucket()
    {
        for (int i = 0; i < numofbuckets; i++) {
            if (bucketV[i] != NULL) {
                if(initialdynamicsize)
                  free(bucketV[i]);
                else
                  delete[] bucketV[i];
                bucketV[i] = NULL;
            }
        }
        if(initialdynamicsize)
          delete [] dynamicsize;

        delete[] bucketV;
        bucketV = NULL;
        delete[] lastelementindexV;
    }